

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_load_extension(sqlite3 *db,char *zFile,char *zProc,char **pzErrMsg)

{
  ulong uVar1;
  byte bVar2;
  sqlite3_vfs *psVar3;
  long lVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  size_t sVar9;
  char *pcVar10;
  void *pvVar11;
  char *pcVar12;
  _func_void *p_Var13;
  byte *pbVar14;
  size_t sVar15;
  char *zBuf;
  void **__dest;
  uint uVar16;
  ulong uVar17;
  sqlite3_uint64 n;
  long in_FS_OFFSET;
  void *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  psVar3 = db->pVfs;
  local_40 = (void *)0x0;
  sVar9 = strlen(zFile);
  if (pzErrMsg == (char **)0x0) {
    if ((db->flags & 0x10000) != 0) goto LAB_00127068;
  }
  else {
    *pzErrMsg = (char *)0x0;
    if ((db->flags & 0x10000) != 0) {
LAB_00127068:
      pcVar10 = "sqlite3_extension_init";
      if (zProc != (char *)0x0) {
        pcVar10 = zProc;
      }
      if (sVar9 - 0x1001 < 0xfffffffffffff000) {
LAB_0012708f:
        if (pzErrMsg != (char **)0x0) {
          pcVar10 = (char *)sqlite3_malloc64(sVar9 + 300);
          *pzErrMsg = pcVar10;
          if (pcVar10 != (char *)0x0) {
            sqlite3_snprintf((int)(sVar9 + 300),pcVar10,"unable to open shared library [%.*s]",
                             0x1000,zFile);
            (*psVar3->xDlError)(psVar3,(int)sVar9 + 299,pcVar10);
          }
          iVar8 = 1;
          goto LAB_001272f7;
        }
      }
      else {
        pvVar11 = (*psVar3->xDlOpen)(psVar3,zFile);
        bVar5 = true;
        while ((bVar5 && (pvVar11 == (void *)0x0))) {
          pcVar12 = sqlite3_mprintf("%s.%s",zFile,"so");
          if (pcVar12 == (char *)0x0) goto LAB_001271d5;
          if (sVar9 < 0xffe) {
            pvVar11 = (*psVar3->xDlOpen)(psVar3,pcVar12);
          }
          else {
            pvVar11 = (void *)0x0;
          }
          sqlite3_free(pcVar12);
          bVar5 = false;
        }
        if (pvVar11 == (void *)0x0) goto LAB_0012708f;
        p_Var13 = (*psVar3->xDlSym)(psVar3,pvVar11,pcVar10);
        if (zProc == (char *)0x0 && p_Var13 == (_func_void *)0x0) {
          uVar6 = sqlite3Strlen30(zFile);
          pcVar10 = (char *)sqlite3_malloc64((ulong)(uVar6 + 0x1e));
          if (pcVar10 == (char *)0x0) {
            (*psVar3->xDlClose)(psVar3,pvVar11);
LAB_001271d5:
            iVar8 = 7;
            goto LAB_001272f7;
          }
          builtin_strncpy(pcVar10,"sqlite3_",8);
          uVar17 = (ulong)uVar6;
          do {
            if ((long)uVar17 < 1) {
              uVar6 = 0;
              goto LAB_001271fd;
            }
            uVar1 = uVar17 - 1;
            lVar4 = uVar17 - 1;
            uVar17 = uVar1;
          } while (zFile[lVar4] != '/');
          uVar6 = (int)uVar1 + 1;
LAB_001271fd:
          iVar8 = sqlite3_strnicmp(zFile + uVar6,"lib",3);
          uVar16 = uVar6 + 3;
          if (iVar8 != 0) {
            uVar16 = uVar6;
          }
          pbVar14 = (byte *)(zFile + (int)uVar16);
          iVar8 = 8;
          while( true ) {
            bVar2 = *pbVar14;
            if ((bVar2 == 0) || (bVar2 == 0x2e)) break;
            if ((""[bVar2] & 2) != 0) {
              pcVar10[iVar8] = ""[(uint)(int)(char)bVar2];
              iVar8 = iVar8 + 1;
            }
            pbVar14 = pbVar14 + 1;
          }
          (pcVar10 + (long)iVar8 + 4)[0] = 't';
          (pcVar10 + (long)iVar8 + 4)[1] = '\0';
          builtin_strncpy(pcVar10 + iVar8,"_ini",4);
          p_Var13 = (*psVar3->xDlSym)(psVar3,pvVar11,pcVar10);
          pcVar12 = pcVar10;
        }
        else {
          pcVar12 = (char *)0x0;
        }
        if (p_Var13 == (_func_void *)0x0) {
          if (pzErrMsg != (char **)0x0) {
            sVar15 = strlen(pcVar10);
            n = sVar9 + sVar15 + 300;
            zBuf = (char *)sqlite3_malloc64(n);
            *pzErrMsg = zBuf;
            if (zBuf != (char *)0x0) {
              iVar8 = (int)n;
              sqlite3_snprintf(iVar8,zBuf,"no entry point [%s] in shared library [%s]",pcVar10,zFile
                              );
              (*psVar3->xDlError)(psVar3,iVar8 + -1,zBuf);
            }
          }
          (*psVar3->xDlClose)(psVar3,pvVar11);
          sqlite3_free(pcVar12);
          iVar8 = 1;
          goto LAB_001272f7;
        }
        sqlite3_free(pcVar12);
        iVar7 = (*p_Var13)(db,&local_40,&sqlite3Apis);
        if (iVar7 == 0) {
          __dest = (void **)sqlite3DbMallocZero(db,(long)db->nExtension * 8 + 8);
          iVar8 = 7;
          if (__dest != (void **)0x0) {
            if (0 < (long)db->nExtension) {
              memcpy(__dest,db->aExtension,(long)db->nExtension << 3);
            }
            sqlite3DbFree(db,db->aExtension);
            db->aExtension = __dest;
            iVar8 = db->nExtension;
            db->nExtension = iVar8 + 1;
            __dest[iVar8] = pvVar11;
            iVar8 = 0;
          }
          goto LAB_001272f7;
        }
        iVar8 = 0;
        if (iVar7 == 0x100) goto LAB_001272f7;
        if (pzErrMsg != (char **)0x0) {
          pcVar10 = sqlite3_mprintf("error during initialization: %s",local_40);
          *pzErrMsg = pcVar10;
        }
        sqlite3_free(local_40);
        (*psVar3->xDlClose)(psVar3,pvVar11);
      }
      iVar8 = 1;
      goto LAB_001272f7;
    }
    pcVar10 = sqlite3_mprintf("not authorized");
    *pzErrMsg = pcVar10;
  }
  iVar8 = 1;
LAB_001272f7:
  iVar8 = sqlite3ApiExit(db,iVar8);
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar8;
}

Assistant:

SQLITE_API int sqlite3_load_extension(
  sqlite3 *db,          /* Load the extension into this database connection */
  const char *zFile,    /* Name of the shared library containing extension */
  const char *zProc,    /* Entry point.  Use "sqlite3_extension_init" if 0 */
  char **pzErrMsg       /* Put error message here if not 0 */
){
  int rc;
  sqlite3_mutex_enter(db->mutex);
  rc = sqlite3LoadExtension(db, zFile, zProc, pzErrMsg);
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}